

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

uint fmt::internal::parse_nonnegative_int<char>(char **s)

{
  char *pcVar1;
  uint uVar2;
  FormatError *this;
  char *pcVar3;
  uint uVar4;
  
  uVar2 = 0;
  pcVar1 = *s;
  do {
    pcVar3 = pcVar1 + 1;
    *s = pcVar3;
    uVar4 = ((int)*pcVar1 + uVar2 * 10) - 0x30;
    if (uVar4 < uVar2) {
      uVar4 = 0xffffffff;
      break;
    }
    uVar2 = uVar4;
    pcVar1 = pcVar3;
  } while ((byte)(*pcVar3 - 0x30U) < 10);
  if ((int)uVar4 < 0) {
    this = (FormatError *)__cxa_allocate_exception(0x10);
    FormatError::FormatError(this,(CStringRef)0x21be65);
    __cxa_throw(this,&FormatError::typeinfo,FormatError::~FormatError);
  }
  return uVar4;
}

Assistant:

unsigned parse_nonnegative_int(const Char *&s) {
  assert('0' <= *s && *s <= '9');
  unsigned value = 0;
  do {
    unsigned new_value = value * 10 + (*s++ - '0');
    // Check if value wrapped around.
    if (new_value < value) {
      value = (std::numeric_limits<unsigned>::max)();
      break;
    }
    value = new_value;
  } while ('0' <= *s && *s <= '9');
  // Convert to unsigned to prevent a warning.
  unsigned max_int = (std::numeric_limits<int>::max)();
  if (value > max_int)
    FMT_THROW(FormatError("number is too big"));
  return value;
}